

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# item_event_visitor.hpp
# Opt level: O0

bool __thiscall
jsoncons::basic_item_event_visitor<char>::visit_typed_array
          (basic_item_event_visitor<char> *this,span<const_unsigned_char,_18446744073709551615UL> *s
          ,semantic_tag tag,ser_context *context,error_code *ec)

{
  bool bVar1;
  ser_context *context_00;
  ser_context *psVar2;
  span<const_unsigned_char,_18446744073709551615UL> *in_RSI;
  basic_item_event_visitor<char> *in_RDI;
  error_code *in_R8;
  const_iterator p;
  ser_context *in_stack_ffffffffffffffb8;
  size_t in_stack_ffffffffffffffc8;
  ser_context *value;
  
  detail::span<const_unsigned_char,_18446744073709551615UL>::size(in_RSI);
  begin_array((basic_item_event_visitor<char> *)in_R8,in_stack_ffffffffffffffc8,
              (semantic_tag)((ulong)in_RDI >> 0x38),in_stack_ffffffffffffffb8,(error_code *)0x1a8610
             );
  bVar1 = std::error_code::operator_cast_to_bool(in_R8);
  if (!bVar1) {
    context_00 = (ser_context *)
                 detail::span<const_unsigned_char,_18446744073709551615UL>::begin(in_RSI);
    while (value = context_00,
          psVar2 = (ser_context *)
                   detail::span<const_unsigned_char,_18446744073709551615UL>::end(in_RSI),
          context_00 != psVar2) {
      uint64_value((basic_item_event_visitor<char> *)in_R8,(uint64_t)value,
                   (semantic_tag)((ulong)in_RDI >> 0x38),context_00,(error_code *)0x1a867c);
      bVar1 = std::error_code::operator_cast_to_bool(in_R8);
      if (bVar1) {
        return true;
      }
      context_00 = (ser_context *)((long)&value->_vptr_ser_context + 1);
    }
    end_array(in_RDI,context_00,(error_code *)0x1a86bd);
  }
  return true;
}

Assistant:

virtual JSONCONS_VISITOR_RETURN_TYPE visit_typed_array(const jsoncons::span<const uint8_t>& s, 
            semantic_tag tag,
            const ser_context& context, 
            std::error_code& ec)  
        {
            begin_array(s.size(), tag, context, ec);
            if (JSONCONS_UNLIKELY(ec)) {JSONCONS_VISITOR_RETURN;}
            for (auto p = s.begin(); p != s.end(); ++p)
            {
                uint64_value(*p, semantic_tag::none, context, ec);
                if (JSONCONS_UNLIKELY(ec)) {JSONCONS_VISITOR_RETURN;}
            }
            end_array(context, ec);
            JSONCONS_VISITOR_RETURN;
        }